

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

uint8_t skipdata_size(cs_struct *handle)

{
  cs_struct *handle_local;
  
  switch(handle->arch) {
  case CS_ARCH_ARM:
    if ((handle->mode & CS_MODE_MICRO) == CS_MODE_ARM) {
      handle_local._7_1_ = '\x04';
    }
    else {
      handle_local._7_1_ = '\x02';
    }
    break;
  case CS_ARCH_ARM64:
  case CS_ARCH_MIPS:
  case CS_ARCH_PPC:
  case CS_ARCH_SPARC:
    handle_local._7_1_ = '\x04';
    break;
  case CS_ARCH_X86:
    handle_local._7_1_ = '\x01';
    break;
  case CS_ARCH_SYSZ:
    handle_local._7_1_ = '\x02';
    break;
  case CS_ARCH_XCORE:
    handle_local._7_1_ = '\x02';
    break;
  default:
    handle_local._7_1_ = 0xff;
  }
  return handle_local._7_1_;
}

Assistant:

static uint8_t skipdata_size(cs_struct *handle)
{
	switch(handle->arch) {
		default:
			// should never reach
			return -1;
		case CS_ARCH_ARM:
			// skip 2 bytes on Thumb mode.
			if (handle->mode & CS_MODE_THUMB)
				return 2;
			// otherwise, skip 4 bytes
			return 4;
		case CS_ARCH_ARM64:
		case CS_ARCH_MIPS:
		case CS_ARCH_PPC:
		case CS_ARCH_SPARC:
			// skip 4 bytes
			return 4;
		case CS_ARCH_SYSZ:
			// SystemZ instruction's length can be 2, 4 or 6 bytes,
			// so we just skip 2 bytes
			return 2;
		case CS_ARCH_X86:
			// X86 has no restriction on instruction alignment
			return 1;
		case CS_ARCH_XCORE:
			// XCore instruction's length can be 2 or 4 bytes,
			// so we just skip 2 bytes
			return 2;
	}
}